

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_4dPoint::Transform(ON_4dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double ww;
  double zz;
  double yy;
  double xx;
  ON_Xform *xform_local;
  ON_4dPoint *this_local;
  
  dVar1 = xform->m_xform[1][0];
  dVar2 = this->x;
  dVar3 = xform->m_xform[1][1];
  dVar4 = xform->m_xform[1][2];
  dVar5 = xform->m_xform[1][3];
  dVar6 = xform->m_xform[2][0];
  dVar7 = this->x;
  dVar8 = xform->m_xform[2][1];
  dVar9 = this->y;
  dVar10 = xform->m_xform[2][2];
  dVar11 = xform->m_xform[2][3];
  dVar12 = xform->m_xform[3][0];
  dVar13 = this->x;
  dVar14 = xform->m_xform[3][1];
  dVar15 = this->y;
  dVar16 = xform->m_xform[3][2];
  dVar17 = this->z;
  dVar18 = xform->m_xform[3][3];
  this->x = xform->m_xform[0][3] * this->w +
            xform->m_xform[0][2] * this->z +
            xform->m_xform[0][0] * this->x + xform->m_xform[0][1] * this->y;
  this->y = dVar5 * this->w + dVar4 * this->z + dVar1 * dVar2 + dVar3 * this->y;
  this->z = dVar11 * this->w + dVar10 * this->z + dVar6 * dVar7 + dVar8 * dVar9;
  this->w = dVar18 * this->w + dVar16 * dVar17 + dVar12 * dVar13 + dVar14 * dVar15;
  return;
}

Assistant:

void ON_4dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,zz,ww;
  xx = xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z + xform.m_xform[0][3]*w;
  yy = xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z + xform.m_xform[1][3]*w;
  zz = xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z + xform.m_xform[2][3]*w;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3]*w;
  x = xx;
  y = yy;
  z = zz;
  w = ww;
}